

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

environment_estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *
nonius::detail::estimate_clock_resolution<std::chrono::_V2::system_clock>(int iterations)

{
  outlier_classification outliers;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> fun;
  environment_estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *in_RDI;
  vector<double,_std::allocator<double>_> r;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffed0;
  vector<double,_std::allocator<double>_> *this;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffef0;
  undefined8 local_e0;
  undefined8 uStack_d8;
  int local_d0;
  double local_b8;
  duration<double,_std::ratio<1L,_1000000000L>_> local_b0;
  code *local_a8;
  int seed;
  parameters *params;
  Duration<std::chrono::_V2::system_clock> how_long;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last_00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first;
  vector<double,_std::allocator<double>_> local_20;
  
  last_00._M_current = (double *)0x0;
  first._M_current = (double *)0x0;
  how_long.__r = 0;
  seed = 0;
  params = (parameters *)0x0;
  parameters::parameters((parameters *)0x21b06c);
  fun = std::chrono::
        duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffec8);
  local_a8 = resolution<std::chrono::_V2::system_clock>;
  run_for_at_least<std::chrono::_V2::system_clock,std::vector<double,std::allocator<double>>(*)(int)>
            (params,how_long,seed,(_func_vector<double,_std::allocator<double>_>_int **)fun.__r);
  last._M_current = (double *)&local_20;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  timing<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::vector<double,_std::allocator<double>_>_>
  ::~timing((timing<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::vector<double,_std::allocator<double>_>_>
             *)0x21b0f0);
  parameters::~parameters((parameters *)0x21b0fd);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffec8);
  std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffec8);
  local_b8 = mean<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                       (in_stack_fffffffffffffef0,last);
  std::chrono::duration<double,std::ratio<1l,1000000000l>>::duration<double,void>
            ((duration<double,std::ratio<1l,1000000000l>> *)&local_b0,&local_b8);
  this = &local_20;
  std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffec8);
  std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffec8);
  classify_outliers<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (first,last_00);
  outliers._8_8_ = uStack_d8;
  outliers._0_8_ = local_e0;
  outliers.high_severe = local_d0;
  environment_estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>::
  environment_estimate(in_RDI,local_b0,outliers);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  return in_RDI;
}

Assistant:

environment_estimate<FloatDuration<Clock>> estimate_clock_resolution(int iterations) {
            auto r = run_for_at_least<Clock>({}, chrono::duration_cast<Duration<Clock>>(clock_resolution_estimation_time), iterations, &resolution<Clock>)
                    .result;
            return {
                FloatDuration<Clock>(mean(r.begin(), r.end())),
                classify_outliers(r.begin(), r.end()),
            };
        }